

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_cell_tec(REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
                   REF_BOOL binary,FILE *file)

{
  REF_STATUS RVar1;
  uint uVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_LONG ref_private_status_reis_ai;
  REF_MPI ref_mpi;
  int iVar10;
  char *pcVar11;
  REF_LONG ref_private_status_reis_bi;
  size_t sVar12;
  REF_INT RVar13;
  long lVar14;
  ulong uVar15;
  REF_INT ncell;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  REF_STATUS local_1c4;
  int local_1c0;
  int local_1bc;
  size_t local_1b8;
  REF_GLOB *local_1b0;
  REF_MPI local_1a8;
  void *local_1a0;
  REF_NODE local_198;
  REF_INT local_18c;
  void *local_188;
  size_t local_180;
  REF_INT local_178 [28];
  REF_GLOB aRStack_108 [27];
  
  local_1a0 = (void *)CONCAT44(local_1a0._4_4_,binary);
  ref_mpi = ref_node->ref_mpi;
  uVar3 = ref_cell->node_per;
  uVar15 = (ulong)uVar3;
  local_1b0 = l2c;
  local_198 = ref_node;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"tet cell start");
  }
  local_1a8 = ref_mpi;
  local_180 = ncell_expected;
  if ((ref_mpi->id == 0) && (0 < ref_cell->max)) {
    iVar10 = 0;
    local_1b8 = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,iVar10,local_178);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,local_198,iVar10,&local_1bc);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x16a,"ref_gather_cell_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi->id == local_1bc) {
          if (0 < (int)uVar3) {
            uVar7 = 0;
            do {
              aRStack_108[uVar7] = local_1b0[local_178[uVar7]];
              uVar7 = uVar7 + 1;
            } while (uVar15 != uVar7);
          }
          if ((int)local_1a0 == 0) {
            if (0 < (int)uVar3) {
              uVar7 = 0;
              do {
                aRStack_108[uVar7] = aRStack_108[uVar7] + 1;
                fprintf((FILE *)file," %ld");
                uVar7 = uVar7 + 1;
              } while (uVar15 != uVar7);
            }
            fputc(10,(FILE *)file);
          }
          else if (0 < (int)uVar3) {
            uVar7 = 0;
            do {
              local_1c0 = (int)aRStack_108[uVar7];
              sVar12 = fwrite(&local_1c0,4,1,(FILE *)file);
              if (sVar12 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x173,"ref_gather_cell_tec","int c2n",1,sVar12);
                return 1;
              }
              uVar7 = uVar7 + 1;
            } while (uVar15 != uVar7);
          }
          local_1b8 = local_1b8 + 1;
          ref_mpi = local_1a8;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < ref_cell->max);
  }
  else {
    local_1b8 = 0;
  }
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"tet cell master");
  }
  if (ref_mpi->id == 0) {
    sVar12 = local_1b8;
    if (1 < ref_mpi->n) {
      local_198 = (REF_NODE)(uVar15 * 8);
      RVar13 = 1;
      do {
        uVar2 = ref_mpi_gather_recv(ref_mpi,&local_1c0,1,1,RVar13);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x187,"ref_gather_cell_tec",(ulong)uVar2,"recv ncell");
          return uVar2;
        }
        uVar2 = local_1c0 * uVar3;
        if ((int)uVar2 < 0) {
          uVar9 = 0x188;
          goto LAB_00120c92;
        }
        local_18c = RVar13;
        pRVar4 = (REF_GLOB *)malloc((ulong)uVar2 * 8);
        if (pRVar4 == (REF_GLOB *)0x0) {
          pcVar11 = "malloc c2n of REF_GLOB NULL";
          uVar9 = 0x188;
          goto LAB_00120ce7;
        }
        local_1b0 = pRVar4;
        pvVar5 = malloc((ulong)uVar2 << 2);
        RVar13 = local_18c;
        if (pvVar5 == (void *)0x0) {
          pcVar11 = "malloc int_c2n of REF_INT NULL";
          uVar9 = 0x189;
          goto LAB_00120ce7;
        }
        local_188 = pvVar5;
        uVar2 = ref_mpi_gather_recv(local_1a8,local_1b0,uVar2,2,local_18c);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x18c,"ref_gather_cell_tec",(ulong)uVar2,"recv c2n");
          return uVar2;
        }
        uVar7 = (long)(int)uVar3 * (long)local_1c0;
        if ((int)local_1a0 == 0) {
          if (0 < (int)uVar7) {
            uVar8 = 0;
            do {
              local_1b0[uVar8] = local_1b0[uVar8] + 1;
              uVar8 = uVar8 + 1;
            } while ((uVar7 & 0xffffffff) != uVar8);
          }
          if (0 < local_1c0) {
            lVar14 = 0;
            pRVar4 = local_1b0;
            local_1b8 = sVar12;
            do {
              if (0 < (int)uVar3) {
                uVar7 = 0;
                do {
                  fprintf((FILE *)file," %ld",pRVar4[uVar7]);
                  uVar7 = uVar7 + 1;
                } while (uVar15 != uVar7);
              }
              fputc(10,(FILE *)file);
              lVar14 = lVar14 + 1;
              pRVar4 = (REF_GLOB *)((long)pRVar4 + (long)local_198);
              sVar12 = local_1b8;
              RVar13 = local_18c;
            } while (lVar14 < local_1c0);
          }
        }
        else {
          if (0 < (int)uVar7) {
            uVar8 = 0;
            do {
              *(int *)((long)local_188 + uVar8 * 4) = (int)local_1b0[uVar8];
              uVar8 = uVar8 + 1;
            } while ((uVar7 & 0xffffffff) != uVar8);
          }
          sVar6 = fwrite(local_188,4,uVar7,(FILE *)file);
          if (sVar6 != uVar7) {
            local_1b8 = sVar6;
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x194,"ref_gather_cell_tec","int c2n",uVar7,sVar6);
            local_1c4 = 1;
            sVar6 = local_1b8;
          }
          if (sVar6 != uVar7) {
            return local_1c4;
          }
        }
        sVar12 = sVar12 + (long)local_1c0;
        free(local_188);
        free(local_1b0);
        RVar13 = RVar13 + 1;
        ref_mpi = local_1a8;
      } while (RVar13 < local_1a8->n);
    }
  }
  else {
    local_1c0 = 0;
    if (0 < ref_cell->max) {
      iVar10 = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,iVar10,local_178);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,local_198,iVar10,&local_1bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1a8,"ref_gather_cell_tec",(ulong)uVar2,"part");
            return uVar2;
          }
          if (ref_mpi->id == local_1bc) {
            local_1c0 = local_1c0 + 1;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < ref_cell->max);
    }
    uVar2 = ref_mpi_gather_send(ref_mpi,&local_1c0,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1ab,"ref_gather_cell_tec",(ulong)uVar2,"send ncell");
      return uVar2;
    }
    if ((int)(local_1c0 * uVar3) < 0) {
      uVar9 = 0x1ac;
LAB_00120c92:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_cell_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    local_1a0 = malloc((ulong)(local_1c0 * uVar3) << 3);
    if (local_1a0 == (void *)0x0) {
      pcVar11 = "malloc c2n of REF_GLOB NULL";
      uVar9 = 0x1ac;
      local_1a0 = (void *)0x0;
LAB_00120ce7:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_cell_tec",pcVar11);
      return 2;
    }
    local_1c0 = 0;
    if (0 < ref_cell->max) {
      iVar10 = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,iVar10,local_178);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,local_198,iVar10,&local_1bc);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1af,"ref_gather_cell_tec",(ulong)uVar2,"part");
            return uVar2;
          }
          if (ref_mpi->id == local_1bc) {
            if (0 < (int)uVar3) {
              uVar7 = 0;
              do {
                *(REF_GLOB *)((long)local_1a0 + uVar7 * 8 + (long)(int)uVar3 * (long)local_1c0 * 8)
                     = local_1b0[local_178[uVar7]];
                uVar7 = uVar7 + 1;
              } while (uVar15 != uVar7);
            }
            local_1c0 = local_1c0 + 1;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < ref_cell->max);
    }
    uVar3 = ref_mpi_gather_send(ref_mpi,local_1a0,uVar3 * local_1c0,2);
    sVar12 = local_1b8;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1b7,"ref_gather_cell_tec",(ulong)uVar3,"send c2n");
      return uVar3;
    }
    free(local_1a0);
    ref_mpi = local_1a8;
  }
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"tet cell off");
  }
  if ((ref_mpi->id == 0) && (sVar12 != local_180)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1c0,
           "ref_gather_cell_tec","cell count mismatch",local_180,sVar12);
    local_1c4 = 1;
  }
  else {
    local_1c4 = 0;
  }
  return local_1c4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_tec(REF_NODE ref_node,
                                              REF_CELL ref_cell,
                                              REF_LONG ncell_expected,
                                              REF_GLOB *l2c, REF_BOOL binary,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell start");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        if (binary) {
          for (node = 0; node < node_per; node++) {
            int int_node;
            int_node = (int)globals[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            globals[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell master");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell off");

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}